

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

void __thiscall ncnn::ConvolutionDepthWise::ConvolutionDepthWise(ConvolutionDepthWise *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffc0;
  
  Layer::Layer(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__ConvolutionDepthWise_009bb648;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x23));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2d));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x36));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x3f));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x48));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x51));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

ConvolutionDepthWise::ConvolutionDepthWise()
{
    one_blob_only = true;
    support_inplace = false;
}